

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall KokkosTools::SpaceTimeStack::State::~State(State *this)

{
  State *pSVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  Allocations *this_00;
  int space;
  StackNode inv_stack_root;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  pSVar1 = (State *)this->stack_frame;
  if (pSVar1 == this) {
    (pSVar1->stack_root).total_runtime =
         (double)(lVar2 - (pSVar1->stack_root).start_time.impl.__d.__r) * 1e-09 +
         (pSVar1->stack_root).total_runtime;
    StackNode::adopt(&this->stack_root);
    StackNode::reduce_over_mpi(&this->stack_root,false);
    pcVar3 = getenv("KOKKOS_PROFILE_EXPORT_JSON");
    if (pcVar3 == (char *)0x0) {
      StackNode::invert(&inv_stack_root,&this->stack_root);
      StackNode::reduce_over_mpi(&inv_stack_root,false);
      std::operator<<((ostream *)&std::cout,"\nBEGIN KOKKOS PROFILING REPORT:\n");
      std::operator<<((ostream *)&std::cout,"TOTAL TIME: ");
      poVar4 = std::ostream::_M_insert<double>((this->stack_root).max_runtime);
      std::operator<<(poVar4," seconds\n");
      std::operator<<((ostream *)&std::cout,"TOP-DOWN TIME TREE:\n");
      std::operator<<((ostream *)&std::cout,
                      "<average time> <percent of total time> <percent time in Kokkos> <percent MPI imbalance> <remainder> <kernels per second> <number of calls> <name> [type]\n"
                     );
      std::operator<<((ostream *)&std::cout,"===================\n");
      StackNode::print(&this->stack_root,(ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"BOTTOM-UP TIME TREE:\n");
      std::operator<<((ostream *)&std::cout,
                      "<average time> <percent of total time> <percent time in Kokkos> <percent MPI imbalance> <number of calls> <name> [type]\n"
                     );
      std::operator<<((ostream *)&std::cout,"===================\n");
      StackNode::print(&inv_stack_root,(ostream *)&std::cout);
      this_00 = this->hwm_allocations;
      for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"KOKKOS ");
        pcVar3 = get_space_name((int)lVar2);
        poVar4 = std::operator<<(poVar4,pcVar3);
        std::operator<<(poVar4," SPACE:\n");
        std::operator<<((ostream *)&std::cout,"===================\n");
        std::ostream::flush();
        Allocations::print(this_00,(ostream *)&std::cout,false);
        this_00 = this_00 + 1;
      }
      print_process_hwm(false);
      std::operator<<((ostream *)&std::cout,"END KOKKOS PROFILING REPORT.\n");
      std::ostream::flush();
      StackNode::~StackNode(&inv_stack_root);
    }
    else {
      std::ofstream::ofstream(&inv_stack_root,"noname.json",_S_out);
      StackNode::print_json(&this->stack_root,(ostream *)&inv_stack_root);
      std::ofstream::~ofstream(&inv_stack_root);
    }
    lVar2 = 0x2a0;
    do {
      std::
      _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
      ::~_Rb_tree((_Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
                   *)((long)&(this->stack_root).parent + lVar2));
      lVar2 = lVar2 + -0x38;
    } while (lVar2 != 0x188);
    lVar2 = 0x188;
    do {
      std::
      _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
      ::~_Rb_tree((_Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
                   *)((long)&(this->stack_root).parent + lVar2));
      lVar2 = lVar2 + -0x38;
    } while (lVar2 != 0x70);
    StackNode::~StackNode(&this->stack_root);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Program ended before \"");
  StackNode::get_full_name_abi_cxx11_((string *)&inv_stack_root,this->stack_frame);
  poVar4 = std::operator<<(poVar4,(string *)&inv_stack_root);
  std::operator<<(poVar4,"\" ended\n");
  std::__cxx11::string::~string((string *)&inv_stack_root);
  abort();
}

Assistant:

~State() {
    bool mpi_usable = false;
#if USE_MPI
    int mpi_initialized;
    MPI_Initialized(&mpi_initialized);
    if (static_cast<bool>(mpi_initialized)) mpi_usable = true;
#endif
    auto end_time = now();
    if (stack_frame != &stack_root) {
      std::cerr << "Program ended before \"" << stack_frame->get_full_name()
                << "\" ended\n";
      abort();
    }
    stack_frame->end(end_time);
    stack_root.adopt();
    stack_root.reduce_over_mpi(mpi_usable);
    if (getenv("KOKKOS_PROFILE_EXPORT_JSON")) {
#if USE_MPI
      if (mpi_usable) {
        int rank;
        MPI_Comm_rank(MPI_COMM_WORLD, &rank);
        if (rank == 0) {
          std::ofstream fout("noname.json");
          stack_root.print_json(fout);
        }
      } else
#endif
      {
        std::ofstream fout("noname.json");
        stack_root.print_json(fout);
      }
      return;
    }

    auto inv_stack_root = stack_root.invert();
    inv_stack_root.reduce_over_mpi(mpi_usable);

#if USE_MPI
    if (mpi_usable) {
      int rank;
      MPI_Comm_rank(MPI_COMM_WORLD, &rank);
      if (rank == 0) {
        std::cout << "\nBEGIN KOKKOS PROFILING REPORT:\n";
        std::cout << "TOTAL TIME: " << stack_root.max_runtime << " seconds\n";
        std::cout << "TOP-DOWN TIME TREE:\n";
        std::cout << "<average time> <percent of total time> <percent time in "
                     "Kokkos> <percent MPI imbalance> <remainder> <kernels per "
                     "second> <number of calls> <name> [type]\n";
        std::cout << "=================== \n";
        stack_root.print(std::cout);
        std::cout << "BOTTOM-UP TIME TREE:\n";
        std::cout << "<average time> <percent of total time> <percent time in "
                     "Kokkos> <percent MPI imbalance> <number of calls> <name> "
                     "[type]\n";
        std::cout << "=================== \n";
        inv_stack_root.print(std::cout);
      }
      for (int space = 0; space < NSPACES; ++space) {
        if (rank == 0) {
          std::cout << "KOKKOS " << get_space_name(space) << " SPACE:\n";
          std::cout << "=================== \n";
          std::cout.flush();
        }
        hwm_allocations[space].print(std::cout, mpi_usable);
      }
      print_process_hwm(mpi_usable);
      if (rank == 0) {
        std::cout << "END KOKKOS PROFILING REPORT.\n";
        std::cout.flush();
      }
    } else
#endif
    {
      std::cout << "\nBEGIN KOKKOS PROFILING REPORT:\n";
      std::cout << "TOTAL TIME: " << stack_root.max_runtime << " seconds\n";
      std::cout << "TOP-DOWN TIME TREE:\n";
      std::cout << "<average time> <percent of total time> <percent time in "
                   "Kokkos> <percent MPI imbalance> <remainder> <kernels per "
                   "second> <number of calls> <name> [type]\n";
      std::cout << "===================\n";
      stack_root.print(std::cout);
      std::cout << "BOTTOM-UP TIME TREE:\n";
      std::cout
          << "<average time> <percent of total time> <percent time in Kokkos> "
             "<percent MPI imbalance> <number of calls> <name> [type]\n";
      std::cout << "===================\n";
      inv_stack_root.print(std::cout);

      for (int space = 0; space < NSPACES; ++space) {
        std::cout << "KOKKOS " << get_space_name(space) << " SPACE:\n";
        std::cout << "===================\n";
        std::cout.flush();
        hwm_allocations[space].print(std::cout, mpi_usable);
      }
      print_process_hwm(mpi_usable);
      std::cout << "END KOKKOS PROFILING REPORT.\n";
      std::cout.flush();
    }
  }